

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_rect nk_layout_space_rect_to_screen(nk_context *ctx,nk_rect ret)

{
  nk_panel *pnVar1;
  nk_rect nVar2;
  
  nVar2._8_8_ = ret._8_8_;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x462b,
                  "struct nk_rect nk_layout_space_rect_to_screen(struct nk_context *, struct nk_rect)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar1 = ctx->current->layout;
    if (pnVar1 != (nk_panel *)0x0) {
      nVar2.y = ret.y + (pnVar1->at_y - (float)*pnVar1->offset_y);
      nVar2.x = (pnVar1->at_x - (float)*pnVar1->offset_x) + ret.x;
      return nVar2;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x462d,
                  "struct nk_rect nk_layout_space_rect_to_screen(struct nk_context *, struct nk_rect)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x462c,
                "struct nk_rect nk_layout_space_rect_to_screen(struct nk_context *, struct nk_rect)"
               );
}

Assistant:

NK_API struct nk_rect
nk_layout_space_rect_to_screen(struct nk_context *ctx, struct nk_rect ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += layout->at_x - (float)*layout->offset_x;
    ret.y += layout->at_y - (float)*layout->offset_y;
    return ret;
}